

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::BitstringAggBindData::Deserialize(Deserializer *deserializer,AggregateFunction *param_2)

{
  _func_int **local_d0;
  LogicalType local_c8;
  LogicalType local_b0;
  Value max;
  Value min;
  
  LogicalType::LogicalType(&local_b0,SQLNULL);
  Value::Value(&min,&local_b0);
  LogicalType::~LogicalType(&local_b0);
  LogicalType::LogicalType(&local_c8,SQLNULL);
  Value::Value(&max,&local_c8);
  LogicalType::~LogicalType(&local_c8);
  Deserializer::ReadProperty<duckdb::Value>((Deserializer *)param_2,100,"min",&min);
  Deserializer::ReadProperty<duckdb::Value>((Deserializer *)param_2,0x65,"max",&max);
  make_uniq<duckdb::BitstringAggBindData,duckdb::Value&,duckdb::Value&>
            ((duckdb *)&local_d0,&min,&max);
  deserializer->_vptr_Deserializer = local_d0;
  Value::~Value(&max);
  Value::~Value(&min);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)deserializer;
}

Assistant:

static unique_ptr<FunctionData> Deserialize(Deserializer &deserializer, AggregateFunction &) {
		Value min;
		Value max;
		deserializer.ReadProperty(100, "min", min);
		deserializer.ReadProperty(101, "max", max);
		return make_uniq<BitstringAggBindData>(min, max);
	}